

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  __m128i *palVar14;
  longlong lVar15;
  longlong lVar16;
  longlong lVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  longlong lVar24;
  longlong lVar25;
  longlong lVar26;
  longlong lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar72;
  int iVar73;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  __m128i *palVar74;
  __m128i *palVar75;
  __m128i *palVar76;
  undefined8 *puVar77;
  uint uVar78;
  int iVar79;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  int32_t in_R9D;
  int iVar80;
  uint uVar88;
  ulong uVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  int iVar89;
  long lVar85;
  long lVar86;
  long lVar87;
  uint uVar90;
  int iVar91;
  uint uVar92;
  uint uVar93;
  uint uVar95;
  ulong uVar94;
  int iVar96;
  uint uVar97;
  uint uVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  int32_t in_stack_ffffffffffffeb38;
  int local_14c0;
  int local_14b8;
  int local_14ac;
  ulong uStack_14a8;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t h;
  int local_11e0;
  int local_11dc;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t length;
  int32_t similar;
  int32_t matches;
  int32_t score;
  __m128i vOne;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int32_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_1020;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_fa8;
  int iStack_fa4;
  int iStack_fa0;
  int iStack_f9c;
  int iStack_f64;
  int iStack_f60;
  int iStack_f5c;
  int iStack_f44;
  int iStack_f40;
  int iStack_f3c;
  undefined4 local_f38;
  int iStack_f34;
  int iStack_f30;
  int iStack_f2c;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  int local_ee8;
  int iStack_ee4;
  int iStack_ee0;
  int iStack_edc;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  int local_ec8;
  int iStack_ec4;
  int iStack_ec0;
  int iStack_ebc;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  int local_ea8;
  int iStack_ea4;
  int iStack_ea0;
  int iStack_e9c;
  int local_e98;
  int iStack_e94;
  int iStack_e90;
  int iStack_e8c;
  int local_e88;
  int iStack_e84;
  int iStack_e80;
  int iStack_e7c;
  int local_e78;
  int iStack_e74;
  int iStack_e70;
  int iStack_e6c;
  int local_e68;
  int iStack_e64;
  int iStack_e60;
  int iStack_e5c;
  int local_e58;
  int iStack_e54;
  int iStack_e50;
  int iStack_e4c;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  int local_e28;
  int iStack_e24;
  int iStack_e20;
  int iStack_e1c;
  int local_e08;
  int iStack_e04;
  int iStack_e00;
  int iStack_dfc;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  int local_da8;
  int iStack_da4;
  int iStack_da0;
  int iStack_d9c;
  int local_d88;
  int iStack_d84;
  int iStack_d80;
  int iStack_d7c;
  int local_d68;
  int iStack_d64;
  int iStack_d60;
  int iStack_d5c;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  int local_a18;
  int iStack_a14;
  int iStack_a10;
  int iStack_a0c;
  int iStack_9bc;
  int local_928;
  int iStack_924;
  int iStack_920;
  int iStack_91c;
  int local_908;
  int iStack_904;
  int iStack_900;
  int iStack_8fc;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  int local_8b8;
  int iStack_8b4;
  int iStack_8b0;
  int iStack_8ac;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  uint local_878;
  uint uStack_874;
  uint uStack_870;
  uint uStack_86c;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_scan_profile_sse41_128_32","profile"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_scan_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_scan_profile_sse41_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_scan_profile_sse41_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_scan_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_scan_profile_sse41_128_32",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_scan_profile_sse41_128_32",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_scan_profile_sse41_128_32",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_1020 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar71 = (iVar1 + 3) / 4;
    iVar79 = (iVar1 + -1) % iVar71;
    pvVar3 = (profile->profile32).score;
    pvVar4 = (profile->profile32).matches;
    pvVar5 = (profile->profile32).similar;
    if (-open < ppVar2->min) {
      local_14ac = open + -0x80000000;
    }
    else {
      local_14ac = -0x80000000 - ppVar2->min;
    }
    local_14ac = local_14ac + 1;
    iVar72 = 0x7ffffffe - ppVar2->max;
    vSaturationCheckMax[1] = CONCAT44(iVar72,iVar72);
    vSaturationCheckMin[0] = CONCAT44(iVar72,iVar72);
    iVar73 = -iVar71 * gap;
    profile_local = (parasail_profile_t *)parasail_result_new_table3(iVar71 * 4,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x4410401;
      uVar78 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar78;
      *(uint *)&profile_local->field_0xc = uVar78;
      b = parasail_memalign___m128i(0x10,(long)iVar71);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr = parasail_memalign___m128i(0x10,(long)iVar71);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar71);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar71);
      ptr_06 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        c[0] = (long)iVar71;
        c[1] = extraout_RDX;
        parasail_memset___m128i(b_03,c,len);
        c_00[0] = (long)iVar71;
        c_00[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,c_00,len);
        c_01[0] = (long)iVar71;
        c_01[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,c_01,len);
        c_02[0] = (long)iVar71;
        c_02[1] = extraout_RDX_02;
        parasail_memset___m128i(b,c_02,len);
        c_03[0] = (long)iVar71;
        c_03[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,c_03,len);
        c_04[0] = (long)iVar71;
        c_04[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c_04,len);
        c_05[0] = (long)iVar71;
        c_05[1] = extraout_RDX_05;
        parasail_memset___m128i(b_02,c_05,len);
        vGapperL[1]._0_4_ = -open;
        vGapperL[1]._4_4_ = -open;
        vGapper[0]._0_4_ = -open;
        vGapper[0]._4_4_ = -open;
        _segNum = 0x100000001;
        vGapperL[0] = 0x100000001;
        k = iVar71;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = CONCAT44(vGapperL[1]._4_4_,(int)vGapperL[1]);
          ptr_04[k][1] = CONCAT44(vGapper[0]._4_4_,(int)vGapper[0]);
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          vGapperL[1]._0_4_ = (int)vGapperL[1] - gap;
          vGapperL[1]._4_4_ = vGapperL[1]._4_4_ - gap;
          vGapper[0]._0_4_ = (int)vGapper[0] - gap;
          vGapper[0]._4_4_ = vGapper[0]._4_4_ - gap;
          local_e08 = (int)_segNum;
          iStack_e04 = (int)((ulong)_segNum >> 0x20);
          iStack_e00 = (int)vGapperL[0];
          iStack_dfc = (int)((ulong)vGapperL[0] >> 0x20);
          _segNum = CONCAT44(iStack_e04 + 1,local_e08 + 1);
          vGapperL[0] = CONCAT44(iStack_dfc + 1,iStack_e00 + 1);
        }
        local_11dc = 0;
        for (k = 0; k < iVar71; k = k + 1) {
          for (local_11e0 = 0; local_11e0 < 4; local_11e0 = local_11e0 + 1) {
            local_14b8 = -(gap * (local_11e0 * iVar71 + k)) - open;
            if (local_14b8 < -0x80000000) {
              local_14b8 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)local_11e0 * 4) = local_14b8;
          }
          ptr[local_11dc][0] = tmp;
          ptr[local_11dc][1] = h.m[0];
          local_11dc = local_11dc + 1;
        }
        *ptr_06 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          local_14c0 = -(gap * (k + -1)) - open;
          if (local_14c0 < -0x80000000) {
            local_14c0 = -0x80000000;
          }
          ptr_06[k] = local_14c0;
        }
        vNegInfFront[1] = CONCAT44(local_14ac,local_14ac);
        vSaturationCheckMax[0] = CONCAT44(local_14ac,local_14ac);
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar81 = ptr[iVar71 + -1][0];
          uVar94 = b_03[iVar71 + -1][0];
          uVar6 = b_04[iVar71 + -1][0];
          uVar7 = b_05[iVar71 + -1][0];
          iVar80 = ppVar2->mapper[(byte)s2[s1Len]];
          iVar89 = ppVar2->mapper[(byte)s2[s1Len]];
          iVar91 = ppVar2->mapper[(byte)s2[s1Len]];
          local_d58 = (int)(*ptr_04)[0];
          iStack_d54 = (int)((ulong)(*ptr_04)[0] >> 0x20);
          iStack_d50 = (int)(*ptr_04)[1];
          iStack_d4c = (int)((ulong)(*ptr_04)[1] >> 0x20);
          vHtM[1] = CONCAT44(local_14ac - iStack_d54,local_14ac - local_d58);
          vHt[0] = CONCAT44(local_14ac - iStack_d4c,local_14ac - iStack_d50);
          stack0xffffffffffffed18 = ZEXT816(0);
          stack0xffffffffffffed08 = ZEXT816(0);
          stack0xffffffffffffecf8 = ZEXT816(0);
          k = 0;
          pvW = (__m128i *)(uVar7 << 0x20);
          vHpL[0] = b_05[iVar71 + -1][1] << 0x20 | uVar7 >> 0x20;
          vHpL[1] = uVar6 << 0x20;
          vHpS[0] = b_04[iVar71 + -1][1] << 0x20 | uVar6 >> 0x20;
          vHpS[1] = uVar94 << 0x20;
          vHpM[0] = b_03[iVar71 + -1][1] << 0x20 | uVar94 >> 0x20;
          vHpM[1] = uVar81 << 0x20 | (ulong)(uint)ptr_06[s1Len];
          vHp[0] = ptr[iVar71 + -1][1] << 0x20 | uVar81 >> 0x20;
          vF_ext[1] = CONCAT44(local_14ac,local_14ac);
          vF[0] = CONCAT44(local_14ac,local_14ac);
          while( true ) {
            local_e48 = (int)vHtM[1];
            local_7b8 = (int)vF_ext[1];
            iStack_7b4 = (int)((ulong)vF_ext[1] >> 0x20);
            iStack_7b0 = (int)vF[0];
            iStack_7ac = (int)((ulong)vF[0] >> 0x20);
            iStack_e44 = (int)((ulong)vHtM[1] >> 0x20);
            iStack_e40 = (int)vHt[0];
            local_e68 = (int)vF[1];
            iStack_e64 = vF[1]._4_4_;
            iStack_e60 = (int)vF[2];
            if (iVar71 <= k) break;
            lVar8 = ptr[k][0];
            lVar9 = ptr[k][1];
            palVar74 = b_03 + k;
            lVar10 = (*palVar74)[0];
            lVar11 = (*palVar74)[1];
            palVar75 = b_04 + k;
            lVar12 = (*palVar75)[0];
            lVar13 = (*palVar75)[1];
            palVar76 = b_05 + k;
            palVar14 = (__m128i *)(*palVar76)[0];
            lVar15 = (*palVar76)[1];
            lVar16 = b[k][0];
            lVar17 = b[k][1];
            puVar77 = (undefined8 *)((long)pvVar3 + (long)k * 0x10 + (long)(iVar80 * iVar71) * 0x10)
            ;
            uVar18 = *puVar77;
            uVar19 = puVar77[1];
            puVar77 = (undefined8 *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar89 * iVar71) * 0x10)
            ;
            uVar20 = *puVar77;
            uVar21 = puVar77[1];
            puVar77 = (undefined8 *)((long)pvVar5 + (long)k * 0x10 + (long)(iVar91 * iVar71) * 0x10)
            ;
            uVar22 = *puVar77;
            uVar23 = puVar77[1];
            lVar24 = ptr_04[k][0];
            lVar25 = ptr_04[k][1];
            lVar26 = ptr_05[k][0];
            lVar27 = ptr_05[k][1];
            local_d68 = (int)lVar8;
            iStack_d64 = (int)((ulong)lVar8 >> 0x20);
            iStack_d60 = (int)lVar9;
            iStack_d5c = (int)((ulong)lVar9 >> 0x20);
            local_d68 = local_d68 - open;
            iStack_d64 = iStack_d64 - open;
            iStack_d60 = iStack_d60 - open;
            iStack_d5c = iStack_d5c - open;
            local_d88 = (int)lVar16;
            iStack_d84 = (int)((ulong)lVar16 >> 0x20);
            iStack_d80 = (int)lVar17;
            iStack_d7c = (int)((ulong)lVar17 >> 0x20);
            local_d88 = local_d88 - gap;
            iStack_d84 = iStack_d84 - gap;
            iStack_d80 = iStack_d80 - gap;
            iStack_d7c = iStack_d7c - gap;
            case2[1] = CONCAT44(-(uint)(iStack_d84 < iStack_d64),-(uint)(local_d88 < local_d68));
            case1[0] = CONCAT44(-(uint)(iStack_d7c < iStack_d5c),-(uint)(iStack_d80 < iStack_d60));
            uVar78 = (uint)(local_d68 < local_d88) * local_d88 |
                     (uint)(local_d68 >= local_d88) * local_d68;
            uVar88 = (uint)(iStack_d64 < iStack_d84) * iStack_d84 |
                     (uint)(iStack_d64 >= iStack_d84) * iStack_d64;
            uVar90 = (uint)(iStack_d60 < iStack_d80) * iStack_d80 |
                     (uint)(iStack_d60 >= iStack_d80) * iStack_d60;
            uVar95 = (uint)(iStack_d5c < iStack_d7c) * iStack_d7c |
                     (uint)(iStack_d5c >= iStack_d7c) * iStack_d5c;
            vE_ext[1] = CONCAT44(uVar88,uVar78);
            vE[0] = CONCAT44(uVar95,uVar90);
            auVar68._8_8_ = case1[0];
            auVar68._0_8_ = case2[1];
            auVar99 = pblendvb((undefined1  [16])b_00[k],(undefined1  [16])*palVar74,auVar68);
            auVar67._8_8_ = case1[0];
            auVar67._0_8_ = case2[1];
            auVar100 = pblendvb((undefined1  [16])b_01[k],(undefined1  [16])*palVar75,auVar67);
            auVar66._8_8_ = case1[0];
            auVar66._0_8_ = case2[1];
            auVar101 = pblendvb((undefined1  [16])b_02[k],(undefined1  [16])*palVar76,auVar66);
            local_e28 = auVar101._0_4_;
            iStack_e24 = auVar101._4_4_;
            iStack_e20 = auVar101._8_4_;
            iStack_e1c = auVar101._12_4_;
            vHt[1] = CONCAT44(iStack_e24 + 1,local_e28 + 1);
            vEL[0]._0_4_ = iStack_e20 + 1;
            vEL[0]._4_4_ = iStack_e1c + 1;
            iStack_e3c = (int)((ulong)vHt[0] >> 0x20);
            local_e58 = (int)lVar24;
            iStack_e54 = (int)((ulong)lVar24 >> 0x20);
            iStack_e50 = (int)lVar25;
            iStack_e4c = (int)((ulong)lVar25 >> 0x20);
            local_e48 = local_e48 + local_e58;
            iStack_e44 = iStack_e44 + iStack_e54;
            iStack_e40 = iStack_e40 + iStack_e50;
            iStack_e3c = iStack_e3c + iStack_e4c;
            uVar81 = CONCAT44(-(uint)(iStack_e44 < iStack_7b4),-(uint)(local_e48 < local_7b8)) |
                     CONCAT44(-(uint)(iStack_7b4 == iStack_e44),-(uint)(local_7b8 == local_e48));
            uVar94 = CONCAT44(-(uint)(iStack_e3c < iStack_7ac),-(uint)(iStack_e40 < iStack_7b0)) |
                     CONCAT44(-(uint)(iStack_7ac == iStack_e3c),-(uint)(iStack_7b0 == iStack_e40));
            vF_ext[1] = CONCAT44((uint)(iStack_7b4 < iStack_e44) * iStack_e44 |
                                 (uint)(iStack_7b4 >= iStack_e44) * iStack_7b4,
                                 (uint)(local_7b8 < local_e48) * local_e48 |
                                 (uint)(local_7b8 >= local_e48) * local_7b8);
            vF[0] = CONCAT44((uint)(iStack_7ac < iStack_e3c) * iStack_e3c |
                             (uint)(iStack_7ac >= iStack_e3c) * iStack_7ac,
                             (uint)(iStack_7b0 < iStack_e40) * iStack_e40 |
                             (uint)(iStack_7b0 >= iStack_e40) * iStack_7b0);
            auVar65._8_8_ = uVar94;
            auVar65._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffed78,stack0xffffffffffffed18,auVar65);
            auVar64._8_8_ = uVar94;
            auVar64._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffed68,stack0xffffffffffffed08,auVar64);
            iStack_e5c = vF[2]._4_4_;
            local_e78 = (int)lVar26;
            iStack_e74 = (int)((ulong)lVar26 >> 0x20);
            iStack_e70 = (int)lVar27;
            iStack_e6c = (int)((ulong)lVar27 >> 0x20);
            auVar63._4_4_ = iStack_e64 + iStack_e74;
            auVar63._0_4_ = local_e68 + local_e78;
            auVar63._8_4_ = iStack_e60 + iStack_e70;
            auVar63._12_4_ = iStack_e5c + iStack_e6c;
            auVar62._8_8_ = uVar94;
            auVar62._0_8_ = uVar81;
            register0x00001240 = pblendvb(auVar63,stack0xffffffffffffecf8,auVar62);
            local_e88 = (int)vHpM[1];
            iStack_e84 = (int)((ulong)vHpM[1] >> 0x20);
            iStack_e80 = (int)vHp[0];
            iStack_e7c = (int)((ulong)vHp[0] >> 0x20);
            local_e98 = (int)uVar18;
            iStack_e94 = (int)((ulong)uVar18 >> 0x20);
            iStack_e90 = (int)uVar19;
            iStack_e8c = (int)((ulong)uVar19 >> 0x20);
            local_e88 = local_e88 + local_e98;
            iStack_e84 = iStack_e84 + iStack_e94;
            iStack_e80 = iStack_e80 + iStack_e90;
            iStack_e7c = iStack_e7c + iStack_e8c;
            vHpM[1] = CONCAT44(iStack_e84,local_e88);
            vHp[0] = CONCAT44(iStack_e7c,iStack_e80);
            local_ea8 = (int)vHpS[1];
            iStack_ea4 = (int)((ulong)vHpS[1] >> 0x20);
            iStack_ea0 = (int)vHpM[0];
            iStack_e9c = (int)((ulong)vHpM[0] >> 0x20);
            local_eb8 = (int)uVar20;
            iStack_eb4 = (int)((ulong)uVar20 >> 0x20);
            iStack_eb0 = (int)uVar21;
            iStack_eac = (int)((ulong)uVar21 >> 0x20);
            vHpS[1] = CONCAT44(iStack_ea4 + iStack_eb4,local_ea8 + local_eb8);
            vHpM[0] = CONCAT44(iStack_e9c + iStack_eac,iStack_ea0 + iStack_eb0);
            local_ec8 = (int)vHpL[1];
            iStack_ec4 = (int)((ulong)vHpL[1] >> 0x20);
            iStack_ec0 = (int)vHpS[0];
            iStack_ebc = (int)((ulong)vHpS[0] >> 0x20);
            local_ed8 = (int)uVar22;
            iStack_ed4 = (int)((ulong)uVar22 >> 0x20);
            iStack_ed0 = (int)uVar23;
            iStack_ecc = (int)((ulong)uVar23 >> 0x20);
            vHpL[1] = CONCAT44(iStack_ec4 + iStack_ed4,local_ec8 + local_ed8);
            vHpS[0] = CONCAT44(iStack_ebc + iStack_ecc,iStack_ec0 + iStack_ed0);
            local_ee8 = (int)pvW;
            iStack_ee4 = (int)((ulong)pvW >> 0x20);
            iStack_ee0 = (int)vHpL[0];
            iStack_edc = (int)((ulong)vHpL[0] >> 0x20);
            pvW = (__m128i *)CONCAT44(iStack_ee4 + 1,local_ee8 + 1);
            vHpL[0] = CONCAT44(iStack_edc + 1,iStack_ee0 + 1);
            case2[1] = CONCAT44(-(uint)(iStack_e84 < (int)uVar88),-(uint)(local_e88 < (int)uVar78));
            case1[0] = CONCAT44(-(uint)(iStack_e7c < (int)uVar95),-(uint)(iStack_e80 < (int)uVar90))
            ;
            vHtM[1] = CONCAT44((uint)((int)uVar88 < iStack_e84) * iStack_e84 |
                               ((int)uVar88 >= iStack_e84) * uVar88,
                               (uint)((int)uVar78 < local_e88) * local_e88 |
                               ((int)uVar78 >= local_e88) * uVar78);
            vHt[0] = CONCAT44((uint)((int)uVar95 < iStack_e7c) * iStack_e7c |
                              ((int)uVar95 >= iStack_e7c) * uVar95,
                              (uint)((int)uVar90 < iStack_e80) * iStack_e80 |
                              ((int)uVar90 >= iStack_e80) * uVar90);
            vES[1] = auVar99._0_8_;
            vEM[0] = auVar99._8_8_;
            auVar61._8_8_ = vHpM[0];
            auVar61._0_8_ = vHpS[1];
            auVar60._8_8_ = case1[0];
            auVar60._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar61,auVar99,auVar60);
            vEL[1] = auVar100._0_8_;
            vES[0] = auVar100._8_8_;
            auVar59._8_8_ = vHpS[0];
            auVar59._0_8_ = vHpL[1];
            auVar58._8_8_ = case1[0];
            auVar58._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar59,auVar100,auVar58);
            auVar57._8_8_ = vHpL[0];
            auVar57._0_8_ = pvW;
            auVar56._8_8_ = vEL[0];
            auVar56._0_8_ = vHt[1];
            auVar55._8_8_ = case1[0];
            auVar55._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar57,auVar56,auVar55);
            b[k][0] = vE_ext[1];
            b[k][1] = vE[0];
            b_00[k][0] = vES[1];
            b_00[k][1] = vEM[0];
            b_01[k][0] = vEL[1];
            b_01[k][1] = vES[0];
            b_02[k][0] = vHt[1];
            b_02[k][1] = vEL[0];
            ptr[k][0] = vHpM[1];
            ptr[k][1] = vHp[0];
            b_03[k][0] = vHpS[1];
            b_03[k][1] = vHpM[0];
            b_04[k][0] = vHpL[1];
            b_04[k][1] = vHpS[0];
            b_05[k][0] = (longlong)pvW;
            b_05[k][1] = vHpL[0];
            k = k + 1;
            pvW = palVar14;
            vHpL[0] = lVar15;
            vHpL[1] = lVar12;
            vHpS[0] = lVar13;
            vHpS[1] = lVar10;
            vHpM[0] = lVar11;
            vHpM[1] = lVar8;
            vHp[0] = lVar9;
          }
          lVar82 = vHtS[1] << 0x20;
          vHtM[0] = vHtM[0] << 0x20 | (ulong)vHtS[1] >> 0x20;
          vHtS[1] = lVar82;
          lVar83 = vHtL[1] << 0x20;
          vHtS[0] = vHtS[0] << 0x20 | (ulong)vHtL[1] >> 0x20;
          vHtL[1] = lVar83;
          lVar84 = vF[1] << 0x20;
          vHtL[0] = vHtL[0] << 0x20 | (ulong)vF[1] >> 0x20;
          vF[1] = lVar84;
          iVar80 = ptr_06[(long)s1Len + 1];
          local_f18 = (int)(*ptr_04)[0];
          iStack_f14 = (int)((ulong)(*ptr_04)[0] >> 0x20);
          iStack_f10 = (int)(*ptr_04)[1];
          iStack_f0c = (int)((ulong)(*ptr_04)[1] >> 0x20);
          local_f18 = iVar80 + local_f18;
          iStack_f14 = local_e48 + iStack_f14;
          iStack_f10 = iStack_e44 + iStack_f10;
          iStack_f0c = iStack_e40 + iStack_f0c;
          uVar81 = CONCAT44(-(uint)(iStack_7b4 < iStack_f14),-(uint)(local_7b8 < local_f18)) |
                   CONCAT44(-(uint)(iStack_f14 == iStack_7b4),-(uint)(local_f18 == local_7b8));
          uVar94 = CONCAT44(-(uint)(iStack_7ac < iStack_f0c),-(uint)(iStack_7b0 < iStack_f10)) |
                   CONCAT44(-(uint)(iStack_f0c == iStack_7ac),-(uint)(iStack_f10 == iStack_7b0));
          vF_ext[1] = CONCAT44((uint)(iStack_7b4 < iStack_f14) * iStack_f14 |
                               (uint)(iStack_7b4 >= iStack_f14) * iStack_7b4,
                               (uint)(local_7b8 < local_f18) * local_f18 |
                               (uint)(local_7b8 >= local_f18) * local_7b8);
          vF[0] = CONCAT44((uint)(iStack_7ac < iStack_f0c) * iStack_f0c |
                           (uint)(iStack_7ac >= iStack_f0c) * iStack_7ac,
                           (uint)(iStack_7b0 < iStack_f10) * iStack_f10 |
                           (uint)(iStack_7b0 >= iStack_f10) * iStack_7b0);
          auVar54._8_8_ = vHtM[0];
          auVar54._0_8_ = lVar82;
          auVar53._8_8_ = uVar94;
          auVar53._0_8_ = uVar81;
          register0x00001240 = pblendvb(stack0xffffffffffffed18,auVar54,auVar53);
          auVar52._8_8_ = vHtS[0];
          auVar52._0_8_ = lVar83;
          auVar101._8_8_ = uVar94;
          auVar101._0_8_ = uVar81;
          register0x00001240 = pblendvb(stack0xffffffffffffed08,auVar52,auVar101);
          local_f38 = (undefined4)(*ptr_05)[0];
          iStack_f34 = (int)((ulong)(*ptr_05)[0] >> 0x20);
          iStack_f30 = (int)(*ptr_05)[1];
          iStack_f2c = (int)((ulong)(*ptr_05)[1] >> 0x20);
          auVar100._4_4_ = local_e68 + iStack_f34;
          auVar100._0_4_ = local_f38;
          auVar100._8_4_ = iStack_e64 + iStack_f30;
          auVar100._12_4_ = iStack_e60 + iStack_f2c;
          auVar99._8_8_ = uVar94;
          auVar99._0_8_ = uVar81;
          register0x00001240 = pblendvb(stack0xffffffffffffecf8,auVar100,auVar99);
          k = 0;
          while( true ) {
            iStack_f44 = (int)vF_ext[1];
            iStack_f40 = (int)((ulong)vF_ext[1] >> 0x20);
            iStack_f3c = (int)vF[0];
            if (1 < k) break;
            iVar89 = iStack_f44 + iVar73;
            iVar91 = iStack_f40 + iVar73;
            iVar96 = iStack_f3c + iVar73;
            iStack_9bc = (int)((ulong)vF[0] >> 0x20);
            uVar81 = CONCAT44(-(uint)(iStack_f40 < iVar89),-(uint)(iStack_f44 < local_14ac)) |
                     CONCAT44(-(uint)(iVar89 == iStack_f40),-(uint)(local_14ac == iStack_f44));
            uVar94 = CONCAT44(-(uint)(iStack_9bc < iVar96),-(uint)(iStack_f3c < iVar91)) |
                     CONCAT44(-(uint)(iVar96 == iStack_9bc),-(uint)(iVar91 == iStack_f3c));
            vF_ext[1] = CONCAT44((uint)(iStack_f40 < iVar89) * iVar89 |
                                 (uint)(iStack_f40 >= iVar89) * iStack_f40,
                                 (uint)(iStack_f44 < local_14ac) * local_14ac |
                                 (uint)(iStack_f44 >= local_14ac) * iStack_f44);
            vF[0] = CONCAT44((uint)(iStack_9bc < iVar96) * iVar96 |
                             (uint)(iStack_9bc >= iVar96) * iStack_9bc,
                             (uint)(iStack_f3c < iVar91) * iVar91 |
                             (uint)(iStack_f3c >= iVar91) * iStack_f3c);
            auVar51._8_8_ = vFM[0] << 0x20 | (ulong)vFS[1] >> 0x20;
            auVar51._0_8_ = vFS[1] << 0x20;
            auVar50._8_8_ = uVar94;
            auVar50._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffed18,auVar51,auVar50);
            auVar49._8_8_ = vFS[0] << 0x20 | (ulong)vFL[1] >> 0x20;
            auVar49._0_8_ = vFL[1] << 0x20;
            auVar48._8_8_ = uVar94;
            auVar48._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffed08,auVar49,auVar48);
            iStack_f64 = (int)vH[1];
            iStack_f60 = vH[1]._4_4_;
            iStack_f5c = (int)vH[2];
            auVar70._4_4_ = iStack_f60 + iVar71;
            auVar70._0_4_ = iStack_f64 + iVar71;
            auVar70._8_4_ = iStack_f5c + iVar71;
            auVar70._12_4_ = 0;
            auVar47._8_8_ = uVar94;
            auVar47._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xffffffffffffecf8,auVar70 << 0x20,auVar47);
            k = k + 1;
          }
          lVar85 = vFS[1] << 0x20;
          vFM[0] = vFM[0] << 0x20 | (ulong)vFS[1] >> 0x20;
          vFS[1] = lVar85;
          lVar86 = vFL[1] << 0x20;
          vFS[0] = vFS[0] << 0x20 | (ulong)vFL[1] >> 0x20;
          vFL[1] = lVar86;
          lVar87 = vH[1] << 0x20;
          vFL[0] = vFL[0] << 0x20 | (ulong)vH[1] >> 0x20;
          vH[1] = lVar87;
          vF_ext[1] = CONCAT44(iStack_f44,local_14ac);
          vF[0] = CONCAT44(iStack_f3c,iStack_f40);
          case2[1] = CONCAT44(-(uint)(local_e48 < iStack_f44),-(uint)(iVar80 < local_14ac));
          case1[0] = CONCAT44(-(uint)(iStack_e40 < iStack_f3c),-(uint)(iStack_e44 < iStack_f40));
          vHM[1] = CONCAT44((uint)(iStack_f44 < local_e48) * local_e48 |
                            (uint)(iStack_f44 >= local_e48) * iStack_f44,
                            (uint)(local_14ac < iVar80) * iVar80 |
                            (uint)(local_14ac >= iVar80) * local_14ac);
          vH[0] = CONCAT44((uint)(iStack_f3c < iStack_e40) * iStack_e40 |
                           (uint)(iStack_f3c >= iStack_e40) * iStack_f3c,
                           (uint)(iStack_f40 < iStack_e44) * iStack_e44 |
                           (uint)(iStack_f40 >= iStack_e44) * iStack_f40);
          auVar46._8_8_ = vHtM[0];
          auVar46._0_8_ = lVar82;
          auVar45._8_8_ = vFM[0];
          auVar45._0_8_ = lVar85;
          auVar44._8_8_ = case1[0];
          auVar44._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar46,auVar45,auVar44);
          auVar43._8_8_ = vHtS[0];
          auVar43._0_8_ = lVar83;
          auVar42._8_8_ = vFS[0];
          auVar42._0_8_ = lVar86;
          auVar41._8_8_ = case1[0];
          auVar41._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar43,auVar42,auVar41);
          auVar40._8_8_ = vHtL[0];
          auVar40._0_8_ = lVar84;
          auVar39._8_8_ = vFL[0];
          auVar39._0_8_ = lVar87;
          auVar38._8_8_ = case1[0];
          auVar38._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar40,auVar39,auVar38);
          for (k = 0; k < iVar71; k = k + 1) {
            lVar8 = ptr[k][0];
            lVar9 = ptr[k][1];
            lVar10 = b[k][0];
            lVar11 = b[k][1];
            local_da8 = (int)vHM[1];
            iStack_da4 = (int)((ulong)vHM[1] >> 0x20);
            iStack_da0 = (int)vH[0];
            iStack_d9c = (int)((ulong)vH[0] >> 0x20);
            local_da8 = local_da8 - open;
            iStack_da4 = iStack_da4 - open;
            iStack_da0 = iStack_da0 - open;
            iStack_d9c = iStack_d9c - open;
            local_dc8 = (int)vF_ext[1];
            iStack_dc4 = (int)((ulong)vF_ext[1] >> 0x20);
            iStack_dc0 = (int)vF[0];
            iStack_dbc = (int)((ulong)vF[0] >> 0x20);
            local_dc8 = local_dc8 - gap;
            iStack_dc4 = iStack_dc4 - gap;
            iStack_dc0 = iStack_dc0 - gap;
            iStack_dbc = iStack_dbc - gap;
            uVar78 = (uint)(local_da8 < local_dc8) * local_dc8 |
                     (uint)(local_da8 >= local_dc8) * local_da8;
            uVar90 = (uint)(iStack_da4 < iStack_dc4) * iStack_dc4 |
                     (uint)(iStack_da4 >= iStack_dc4) * iStack_da4;
            uVar92 = (uint)(iStack_da0 < iStack_dc0) * iStack_dc0 |
                     (uint)(iStack_da0 >= iStack_dc0) * iStack_da0;
            uVar97 = (uint)(iStack_d9c < iStack_dbc) * iStack_dbc |
                     (uint)(iStack_d9c >= iStack_dbc) * iStack_d9c;
            vF_ext[1] = CONCAT44(uVar90,uVar78);
            vF[0] = CONCAT44(uVar97,uVar92);
            case2[1] = CONCAT44(-(uint)(iStack_dc4 < iStack_da4),-(uint)(local_dc8 < local_da8));
            case1[0] = CONCAT44(-(uint)(iStack_dbc < iStack_d9c),-(uint)(iStack_dc0 < iStack_da0));
            auVar37._8_8_ = case1[0];
            auVar37._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffed18,stack0xffffffffffffecd8,auVar37);
            auVar36._8_8_ = case1[0];
            auVar36._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffed08,stack0xffffffffffffecc8,auVar36);
            auVar35._8_8_ = case1[0];
            auVar35._0_8_ = case2[1];
            auVar99 = pblendvb(stack0xffffffffffffecf8,stack0xffffffffffffecb8,auVar35);
            local_fa8 = auVar99._0_4_;
            iStack_fa4 = auVar99._4_4_;
            iStack_fa0 = auVar99._8_4_;
            iStack_f9c = auVar99._12_4_;
            vH[1] = CONCAT44(iStack_fa4 + 1,local_fa8 + 1);
            vFL[0]._0_4_ = iStack_fa0 + 1;
            vFL[0]._4_4_ = iStack_f9c + 1;
            local_878 = (uint)lVar8;
            uStack_874 = (uint)((ulong)lVar8 >> 0x20);
            uStack_870 = (uint)lVar9;
            uStack_86c = (uint)((ulong)lVar9 >> 0x20);
            local_888 = (int)lVar10;
            iStack_884 = (int)((ulong)lVar10 >> 0x20);
            iStack_880 = (int)lVar11;
            iStack_87c = (int)((ulong)lVar11 >> 0x20);
            uVar88 = (uint)((int)local_878 < local_888) * local_888 |
                     ((int)local_878 >= local_888) * local_878;
            uVar95 = (uint)((int)uStack_874 < iStack_884) * iStack_884 |
                     ((int)uStack_874 >= iStack_884) * uStack_874;
            uVar93 = (uint)((int)uStack_870 < iStack_880) * iStack_880 |
                     ((int)uStack_870 >= iStack_880) * uStack_870;
            uVar98 = (uint)((int)uStack_86c < iStack_87c) * iStack_87c |
                     ((int)uStack_86c >= iStack_87c) * uStack_86c;
            uVar88 = ((int)uVar88 < (int)uVar78) * uVar78 | ((int)uVar88 >= (int)uVar78) * uVar88;
            uVar95 = ((int)uVar95 < (int)uVar90) * uVar90 | ((int)uVar95 >= (int)uVar90) * uVar95;
            uVar93 = ((int)uVar93 < (int)uVar92) * uVar92 | ((int)uVar93 >= (int)uVar92) * uVar93;
            uVar98 = ((int)uVar98 < (int)uVar97) * uVar97 | ((int)uVar98 >= (int)uVar97) * uVar98;
            vHM[1] = CONCAT44(uVar95,uVar88);
            vH[0] = CONCAT44(uVar98,uVar93);
            case2[1] = CONCAT44(-(uint)(uVar95 == uStack_874),-(uint)(uVar88 == local_878));
            case1[0] = CONCAT44(-(uint)(uVar98 == uStack_86c),-(uint)(uVar93 == uStack_870));
            iVar80 = -(uint)(uVar88 == uVar78);
            iVar89 = -(uint)(uVar95 == uVar90);
            iVar91 = -(uint)(uVar93 == uVar92);
            iVar96 = -(uint)(uVar98 == uVar97);
            auVar34._4_4_ = iVar89;
            auVar34._0_4_ = iVar80;
            auVar34._12_4_ = iVar96;
            auVar34._8_4_ = iVar91;
            auVar99 = pblendvb((undefined1  [16])b_00[k],register0x00001240,auVar34);
            auVar33._8_8_ = case1[0];
            auVar33._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar99,(undefined1  [16])b_03[k],auVar33);
            auVar32._4_4_ = iVar89;
            auVar32._0_4_ = iVar80;
            auVar32._12_4_ = iVar96;
            auVar32._8_4_ = iVar91;
            auVar99 = pblendvb((undefined1  [16])b_01[k],register0x00001240,auVar32);
            auVar31._8_8_ = case1[0];
            auVar31._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar99,(undefined1  [16])b_04[k],auVar31);
            auVar29._4_4_ = iVar89;
            auVar29._0_4_ = iVar80;
            auVar29._12_4_ = iVar96;
            auVar29._8_4_ = iVar91;
            auVar30._8_8_ = vFL[0];
            auVar30._0_8_ = vH[1];
            auVar99 = pblendvb((undefined1  [16])b_02[k],auVar30,auVar29);
            auVar28._8_8_ = case1[0];
            auVar28._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar99,(undefined1  [16])b_05[k],auVar28);
            ptr[k][0] = vHM[1];
            ptr[k][1] = vH[0];
            b_03[k][0] = vHS[1];
            b_03[k][1] = vHM[0];
            b_04[k][0] = vHL[1];
            b_04[k][1] = vHS[0];
            b_05[k][0] = vHp[1];
            b_05[k][1] = vHL[0];
            local_148 = (int)vSaturationCheckMax[1];
            iStack_144 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_140 = (int)vSaturationCheckMin[0];
            iStack_13c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            vSaturationCheckMax[1] =
                 CONCAT44(((int)uVar95 < iStack_144) * uVar95 |
                          (uint)((int)uVar95 >= iStack_144) * iStack_144,
                          ((int)uVar88 < local_148) * uVar88 |
                          (uint)((int)uVar88 >= local_148) * local_148);
            vSaturationCheckMin[0] =
                 CONCAT44(((int)uVar98 < iStack_13c) * uVar98 |
                          (uint)((int)uVar98 >= iStack_13c) * iStack_13c,
                          ((int)uVar93 < iStack_140) * uVar93 |
                          (uint)((int)uVar93 >= iStack_140) * iStack_140);
            local_8b8 = (int)vNegInfFront[1];
            iStack_8b4 = (int)((ulong)vNegInfFront[1] >> 0x20);
            iStack_8b0 = (int)vSaturationCheckMax[0];
            iStack_8ac = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            uVar78 = (local_8b8 < (int)uVar88) * uVar88 |
                     (uint)(local_8b8 >= (int)uVar88) * local_8b8;
            uVar88 = (iStack_8b4 < (int)uVar95) * uVar95 |
                     (uint)(iStack_8b4 >= (int)uVar95) * iStack_8b4;
            uVar90 = (iStack_8b0 < (int)uVar93) * uVar93 |
                     (uint)(iStack_8b0 >= (int)uVar93) * iStack_8b0;
            uVar95 = (iStack_8ac < (int)uVar98) * uVar98 |
                     (uint)(iStack_8ac >= (int)uVar98) * iStack_8ac;
            local_8e8 = (int)vHS[1];
            iStack_8e4 = vHS[1]._4_4_;
            iStack_8e0 = (int)vHS[2];
            iStack_8dc = vHS[2]._4_4_;
            uVar78 = (uint)((int)uVar78 < local_8e8) * local_8e8 |
                     ((int)uVar78 >= local_8e8) * uVar78;
            uVar88 = (uint)((int)uVar88 < iStack_8e4) * iStack_8e4 |
                     ((int)uVar88 >= iStack_8e4) * uVar88;
            uVar90 = (uint)((int)uVar90 < iStack_8e0) * iStack_8e0 |
                     ((int)uVar90 >= iStack_8e0) * uVar90;
            uVar95 = (uint)((int)uVar95 < iStack_8dc) * iStack_8dc |
                     ((int)uVar95 >= iStack_8dc) * uVar95;
            local_908 = (int)vHL[1];
            iStack_904 = vHL[1]._4_4_;
            iStack_900 = (int)vHL[2];
            iStack_8fc = vHL[2]._4_4_;
            uVar78 = (uint)((int)uVar78 < local_908) * local_908 |
                     ((int)uVar78 >= local_908) * uVar78;
            uVar88 = (uint)((int)uVar88 < iStack_904) * iStack_904 |
                     ((int)uVar88 >= iStack_904) * uVar88;
            uVar90 = (uint)((int)uVar90 < iStack_900) * iStack_900 |
                     ((int)uVar90 >= iStack_900) * uVar90;
            uVar95 = (uint)((int)uVar95 < iStack_8fc) * iStack_8fc |
                     ((int)uVar95 >= iStack_8fc) * uVar95;
            local_928 = (int)vHp[1];
            iStack_924 = vHp[1]._4_4_;
            iStack_920 = (int)vHp[2];
            iStack_91c = vHp[2]._4_4_;
            vNegInfFront[1] =
                 CONCAT44((uint)((int)uVar88 < iStack_924) * iStack_924 |
                          ((int)uVar88 >= iStack_924) * uVar88,
                          (uint)((int)uVar78 < local_928) * local_928 |
                          ((int)uVar78 >= local_928) * uVar78);
            vSaturationCheckMax[0] =
                 CONCAT44((uint)((int)uVar95 < iStack_91c) * iStack_91c |
                          ((int)uVar95 >= iStack_91c) * uVar95,
                          (uint)((int)uVar90 < iStack_920) * iStack_920 |
                          ((int)uVar90 >= iStack_920) * uVar90);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar71;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                             &profile_local->matrix)->trace->trace_del_table,vH_00,s1Len,s2Len,
                            in_R9D,in_stack_ffffffffffffeb38);
            vH_01[0] = (ulong)(uint)k;
            vH_01[1]._0_4_ = iVar71;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 8),
                            vH_01,s1Len,s2Len,in_R9D,in_stack_ffffffffffffeb38);
            vH_02[0] = (ulong)(uint)k;
            vH_02[1]._0_4_ = iVar71;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 0x10),
                            vH_02,s1Len,s2Len,in_R9D,in_stack_ffffffffffffeb38);
            vH_03[0] = (ulong)(uint)k;
            vH_03[1]._0_4_ = iVar71;
            vH_03[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 0x18),
                            vH_03,s1Len,s2Len,in_R9D,in_stack_ffffffffffffeb38);
          }
        }
        vH_1[0] = ptr[iVar79][1];
        vHM_1[0] = b_03[iVar79][1];
        vHS_1[0] = b_04[iVar79][1];
        vHL_1[0] = b_05[iVar79][1];
        uStack_14a8 = b_05[iVar79][0];
        vHL_1[1] = b_04[iVar79][0];
        vHS_1[1] = b_03[iVar79][0];
        vHM_1[1] = ptr[iVar79][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar71) + 4U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 0x20 | (ulong)vHM_1[1] >> 0x20;
          vHM_1[0] = vHM_1[0] << 0x20 | (ulong)vHS_1[1] >> 0x20;
          vHS_1[0] = vHS_1[0] << 0x20 | (ulong)vHL_1[1] >> 0x20;
          vHL_1[0] = vHL_1[0] << 0x20 | uStack_14a8 >> 0x20;
          uStack_14a8 = uStack_14a8 << 0x20;
          vHL_1[1] = vHL_1[1] << 0x20;
          vHS_1[1] = vHS_1[1] << 0x20;
          vHM_1[1] = vHM_1[1] << 0x20;
        }
        similar = vH_1[0]._4_4_;
        length = vHM_1[0]._4_4_;
        vNegLimit[1]._4_4_ = vHS_1[0]._4_4_;
        vNegLimit[1]._0_4_ = vHL_1[0]._4_4_;
        local_108 = (int)vSaturationCheckMax[1];
        iStack_104 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_100 = (int)vSaturationCheckMin[0];
        iStack_fc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_a18 = (int)vNegInfFront[1];
        iStack_a14 = (int)((ulong)vNegInfFront[1] >> 0x20);
        iStack_a10 = (int)vSaturationCheckMax[0];
        iStack_a0c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar81 = CONCAT44(-(uint)(iStack_fc < local_14ac),-(uint)(iStack_100 < local_14ac)) |
                 CONCAT44(-(uint)(iVar72 < iStack_a0c),-(uint)(iVar72 < iStack_a10));
        auVar69._8_8_ = uVar81;
        auVar69._0_8_ =
             CONCAT44(-(uint)(iStack_104 < local_14ac),-(uint)(local_108 < local_14ac)) |
             CONCAT44(-(uint)(iVar72 < iStack_a14),-(uint)(iVar72 < local_a18));
        if ((((((((((((((((auVar69 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar69 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar69 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar69 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar69 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar69 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar81 >> 7 & 1) != 0) || (uVar81 >> 0xf & 1) != 0) || (uVar81 >> 0x17 & 1) != 0)
               || (uVar81 >> 0x1f & 1) != 0) || (uVar81 >> 0x27 & 1) != 0) ||
             (uVar81 >> 0x2f & 1) != 0) || (uVar81 >> 0x37 & 1) != 0) || (long)uVar81 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          similar = 0;
          length = 0;
          vNegLimit[1]._4_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          local_1020 = 0;
          matrix._4_4_ = 0;
        }
        *(int32_t *)&profile_local->s1 = similar;
        *(int *)((long)&profile_local->s1 + 4) = local_1020;
        profile_local->s1Len = matrix._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->matches =
             length;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             vNegLimit[1]._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)vNegLimit[1];
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32(vHp, vE);
            vH = _mm_max_epi32(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}